

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh4_factory.cpp
# Opt level: O2

Accel * __thiscall embree::BVH4Factory::BVH4QuantizedTriangle4i(BVH4Factory *this,Scene *scene)

{
  BVHN<4> *this_00;
  Builder *builder;
  AccelInstance *this_01;
  Intersectors intersectors;
  Intersectors local_138;
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&TriangleMi<4>::type,scene);
  builder = (*this->BVH4QuantizedTriangle4iSceneBuilderSAH)(this_00,scene,0);
  local_138.collider.name = (char *)0x0;
  local_138.intersector1.intersect = (IntersectFunc)0x0;
  local_138.leafIntersector = (void *)0x0;
  local_138.collider.collide = (CollideFunc)0x0;
  local_138.intersector1.occluded = (OccludedFunc)0x0;
  memset(&local_138.intersector1.name,0,0xe0);
  local_138.ptr = (AccelData *)this_00;
  (*this->QBVH4Triangle4iIntersector1Pluecker)(&local_138.intersector1);
  this_01 = (AccelInstance *)Accel::operator_new(0x180);
  AccelInstance::AccelInstance(this_01,(AccelData *)this_00,builder,&local_138);
  return &this_01->super_Accel;
}

Assistant:

Accel* BVH4Factory::BVH4QuantizedTriangle4i(Scene* scene)
  {
    BVH4* accel = new BVH4(Triangle4i::type,scene);
    Builder* builder = BVH4QuantizedTriangle4iSceneBuilderSAH(accel,scene,0);
    Accel::Intersectors intersectors = QBVH4Triangle4iIntersectors(accel);
    return new AccelInstance(accel,builder,intersectors);
  }